

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O0

PError * p_error_copy(PError *error)

{
  PError *ret;
  PError *error_local;
  
  if (error == (PError *)0x0) {
    error_local = (PError *)0x0;
  }
  else {
    error_local = p_error_new_literal(error->code,error->native_code,error->message);
    if (error_local == (PError *)0x0) {
      error_local = (PError *)0x0;
    }
  }
  return error_local;
}

Assistant:

P_LIB_API PError *
p_error_copy (const PError *error)
{
	PError *ret;

	if (P_UNLIKELY (error == NULL))
		return NULL;

	if (P_UNLIKELY ((ret = p_error_new_literal (error->code,
						    error->native_code,
						    error->message)) == NULL))
		return NULL;

	return ret;
}